

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeTupleMake
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,uint32_t arity)

{
  TupleMake *pTVar1;
  bool bVar2;
  Ok local_dd;
  uint local_dc;
  Err local_d8;
  Err *local_b8;
  Err *err;
  Result<wasm::Ok> _val;
  TupleMake curr;
  allocator<char> local_41;
  Err local_40;
  uint32_t local_1c;
  IRBuilder *pIStack_18;
  uint32_t arity_local;
  IRBuilder *this_local;
  
  local_1c = arity;
  pIStack_18 = this;
  this_local = (IRBuilder *)__return_storage_ptr__;
  if (arity < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"tuple arity must be at least 2",&local_41);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_40);
    wasm::Err::~Err(&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    pTVar1 = (TupleMake *)
             ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
    TupleMake::TupleMake(pTVar1,&this->wasm->allocator);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
               &curr.super_SpecificExpression<(wasm::Expression::Id)57>.super_Expression.type,
               (ulong)local_1c);
    UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitTupleMake
              ((Result<wasm::Ok> *)&err,
               (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pTVar1);
    local_b8 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
    bVar2 = local_b8 != (Err *)0x0;
    if (bVar2) {
      wasm::Err::Err(&local_d8,local_b8);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_d8);
      wasm::Err::~Err(&local_d8);
    }
    local_dc = (uint)bVar2;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
    if (local_dc == 0) {
      pTVar1 = Builder::makeTupleMake<ArenaVector<wasm::Expression*>&>
                         (&this->builder,
                          (ArenaVector<wasm::Expression_*> *)
                          &curr.super_SpecificExpression<(wasm::Expression::Id)57>.super_Expression.
                           type);
      push(this,(Expression *)pTVar1);
      Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_dd);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeTupleMake(uint32_t arity) {
  if (arity < 2) {
    return Err{"tuple arity must be at least 2"};
  }
  TupleMake curr(wasm.allocator);
  curr.operands.resize(arity);
  CHECK_ERR(visitTupleMake(&curr));
  push(builder.makeTupleMake(curr.operands));
  return Ok{};
}